

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generators.cpp
# Opt level: O2

void duckdb::VectorOperations::GenerateSequence
               (Vector *result,idx_t count,SelectionVector *sel,int64_t start,int64_t increment)

{
  bool bVar1;
  InvalidTypeException *this;
  NotImplementedException *this_00;
  allocator local_51;
  string local_50;
  
  bVar1 = LogicalType::IsNumeric(&result->type);
  if (bVar1) {
    switch((result->type).physical_type_) {
    case INT8:
      TemplatedGenerateSequence<signed_char>(result,count,sel,start,increment);
      return;
    default:
      this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_50,"Unimplemented type for generate sequence",&local_51);
      NotImplementedException::NotImplementedException(this_00,&local_50);
      __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    case INT16:
      TemplatedGenerateSequence<short>(result,count,sel,start,increment);
      return;
    case INT32:
      TemplatedGenerateSequence<int>(result,count,sel,start,increment);
      return;
    case INT64:
      TemplatedGenerateSequence<long>(result,count,sel,start,increment);
      return;
    }
  }
  this = (InvalidTypeException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_50,"Can only generate sequences for numeric values!",&local_51);
  InvalidTypeException::InvalidTypeException(this,&result->type,&local_50);
  __cxa_throw(this,&InvalidTypeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void VectorOperations::GenerateSequence(Vector &result, idx_t count, const SelectionVector &sel, int64_t start,
                                        int64_t increment) {
	if (!result.GetType().IsNumeric()) {
		throw InvalidTypeException(result.GetType(), "Can only generate sequences for numeric values!");
	}
	switch (result.GetType().InternalType()) {
	case PhysicalType::INT8:
		TemplatedGenerateSequence<int8_t>(result, count, sel, start, increment);
		break;
	case PhysicalType::INT16:
		TemplatedGenerateSequence<int16_t>(result, count, sel, start, increment);
		break;
	case PhysicalType::INT32:
		TemplatedGenerateSequence<int32_t>(result, count, sel, start, increment);
		break;
	case PhysicalType::INT64:
		TemplatedGenerateSequence<int64_t>(result, count, sel, start, increment);
		break;
	default:
		throw NotImplementedException("Unimplemented type for generate sequence");
	}
}